

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O1

_Bool ecs_is_readonly(ecs_iter_t *it,int32_t column)

{
  ecs_query_t *peVar1;
  void *pvVar2;
  
  peVar1 = it->query;
  _ecs_assert(peVar1 != (ecs_query_t *)0x0,0x32,(char *)0x0,"query != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
              ,0x8b);
  if (peVar1 != (ecs_query_t *)0x0) {
    pvVar2 = _ecs_vector_get((it->query->sig).columns,0x28,0x10,column + -1);
    return *(int *)((long)pvVar2 + 8) == 1;
  }
  __assert_fail("query != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/iter.c"
                ,0x8b,"_Bool ecs_is_readonly(const ecs_iter_t *, int32_t)");
}

Assistant:

bool ecs_is_readonly(
    const ecs_iter_t *it,
    int32_t column)
{
    ecs_query_t *query = it->query;

    /* If this is not a query iterator, readonly is meaningless */
    ecs_assert(query != NULL, ECS_INVALID_OPERATION, NULL);
    (void)query;

    ecs_sig_column_t *column_data = ecs_vector_get(
        it->query->sig.columns, ecs_sig_column_t, column - 1);

    return column_data->inout_kind == EcsIn;
}